

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O0

Error __thiscall asmjit::VMemMgr::release(VMemMgr *this,void *p)

{
  MemNode *pMVar1;
  ulong uVar2;
  ulong uVar3;
  uint8_t *in_RSI;
  pthread_mutex_t *in_RDI;
  bool bVar4;
  MemNode *cur;
  bool stop;
  size_t cont;
  size_t bit;
  size_t cbits;
  size_t ubits;
  size_t *cp;
  size_t *up;
  size_t i;
  size_t bitpos;
  size_t offset;
  MemNode *node;
  AutoLock locked;
  char *in_stack_00000310;
  int in_stack_0000031c;
  char *in_stack_00000320;
  pthread_mutex_t *self;
  MemNode *local_e0;
  long local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  size_t *local_b0;
  size_t *local_a8;
  pthread_mutex_t *node_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Error EVar5;
  
  if (in_RSI == (uint8_t *)0x0) {
    return 0;
  }
  self = in_RDI;
  node_00 = in_RDI;
  pthread_mutex_lock(in_RDI);
  pMVar1 = vMemMgrFindNodeByPtr((VMemMgr *)&self->__data,in_RSI);
  if (pMVar1 != (MemNode *)0x0) {
    uVar2 = (ulong)((long)in_RSI - (long)(pMVar1->super_RbNode).mem) / pMVar1->density;
    uVar3 = uVar2 >> 6;
    local_b8 = pMVar1->baUsed[uVar3];
    local_c0 = pMVar1->baCont[uVar3];
    local_c8 = 1L << ((byte)uVar2 & 0x3f);
    local_d0 = 0;
    local_b0 = pMVar1->baCont + uVar3;
    local_a8 = pMVar1->baUsed + uVar3;
LAB_00127873:
    bVar4 = (local_c0 & local_c8) != 0;
    local_b8 = (local_c8 ^ 0xffffffffffffffff) & local_b8;
    local_c0 = (local_c8 ^ 0xffffffffffffffff) & local_c0;
    local_c8 = local_c8 << 1;
    local_d0 = local_d0 + 1;
    if (bVar4) goto code_r0x001278d2;
    goto LAB_001278da;
  }
  EVar5 = 3;
  goto LAB_00127af4;
code_r0x001278d2:
  if (local_c8 != 0) goto LAB_00127873;
LAB_001278da:
  *local_a8 = local_b8;
  *local_b0 = local_c0;
  if (bVar4) {
    local_b8 = local_a8[1];
    local_c0 = local_b0[1];
    local_c8 = 1;
    local_b0 = local_b0 + 1;
    local_a8 = local_a8 + 1;
    goto LAB_00127873;
  }
  if (pMVar1->used == pMVar1->size) {
    local_e0 = *(MemNode **)((long)self + 0x68);
    do {
      local_e0 = local_e0->prev;
      if (local_e0 == pMVar1) {
        *(MemNode **)((long)self + 0x68) = pMVar1;
        break;
      }
    } while (local_e0 != (MemNode *)0x0);
  }
  uVar2 = pMVar1->density * local_d0;
  if (pMVar1->largestBlock < uVar2) {
    pMVar1->largestBlock = uVar2;
  }
  pMVar1->used = pMVar1->used - uVar2;
  *(ulong *)((long)self + 0x48) = *(long *)((long)self + 0x48) - uVar2;
  if (pMVar1->used == 0) {
    OSUtils::releaseVirtualMemory(self,0x127a43);
    free(pMVar1->baUsed);
    pMVar1->baUsed = (size_t *)0x0;
    pMVar1->baCont = (size_t *)0x0;
    *(size_t *)((long)self + 0x40) = *(long *)((long)self + 0x40) - pMVar1->size;
    pMVar1 = vMemMgrRemoveNode((VMemMgr *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               (MemNode *)&node_00->__data);
    free(pMVar1);
    bVar4 = vMemMgrCheckTree((VMemMgr *)0x127abb);
    if (!bVar4) {
      DebugUtils::assertionFailed(in_stack_00000320,in_stack_0000031c,in_stack_00000310);
    }
  }
  EVar5 = 0;
LAB_00127af4:
  pthread_mutex_unlock(in_RDI);
  return EVar5;
}

Assistant:

Error VMemMgr::release(void* p) noexcept {
  if (!p) return kErrorOk;

  AutoLock locked(_lock);
  MemNode* node = vMemMgrFindNodeByPtr(this, static_cast<uint8_t*>(p));
  if (!node) return DebugUtils::errored(kErrorInvalidArgument);

  size_t offset = (size_t)((uint8_t*)p - (uint8_t*)node->mem);
  size_t bitpos = M_DIV(offset, node->density);
  size_t i = (bitpos / kBitsPerEntity);

  size_t* up = node->baUsed + i;  // Current ubits address.
  size_t* cp = node->baCont + i;  // Current cbits address.
  size_t ubits = *up;             // Current ubits[0] value.
  size_t cbits = *cp;             // Current cbits[0] value.
  size_t bit = (size_t)1 << (bitpos % kBitsPerEntity);

  size_t cont = 0;
  bool stop;

  for (;;) {
    stop = (cbits & bit) == 0;
    ubits &= ~bit;
    cbits &= ~bit;

    bit <<= 1;
    cont++;

    if (stop || bit == 0) {
      *up = ubits;
      *cp = cbits;
      if (stop)
        break;

      ubits = *++up;
      cbits = *++cp;
      bit = 1;
    }
  }

  // If the freed block is fully allocated node then it's needed to
  // update 'optimal' pointer in memory manager.
  if (node->used == node->size) {
    MemNode* cur = _optimal;

    do {
      cur = cur->prev;
      if (cur == node) {
        _optimal = node;
        break;
      }
    } while (cur);
  }

  // Statistics.
  cont *= node->density;
  if (node->largestBlock < cont)
    node->largestBlock = cont;

  node->used -= cont;
  _usedBytes -= cont;

  // If page is empty, we can free it.
  if (node->used == 0) {
    // Free memory associated with node (this memory is not accessed
    // anymore so it's safe).
    vMemMgrReleaseVMem(this, node->mem, node->size);
    Internal::releaseMemory(node->baUsed);

    node->baUsed = nullptr;
    node->baCont = nullptr;

    // Statistics.
    _allocatedBytes -= node->size;

    // Remove node. This function can return different node than
    // passed into, but data is copied into previous node if needed.
    Internal::releaseMemory(vMemMgrRemoveNode(this, node));
    ASMJIT_ASSERT(vMemMgrCheckTree(this));
  }

  return kErrorOk;
}